

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void processIncludeDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *includes,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  TargetPropertyEntry *pTVar1;
  cmLinkImplItem *this;
  MessageType MVar2;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  reference ppTVar6;
  string *psVar7;
  cmLocalGenerator *pcVar8;
  undefined4 extraout_var;
  reference filename;
  ostream *poVar9;
  string *psVar10;
  ulong uVar11;
  cmake *this_00;
  PolicyID id;
  PolicyID id_00;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar12;
  bool local_591;
  cmListFileBacktrace local_590;
  allocator<char> local_579;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  cmListFileBacktrace local_4b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_4a8;
  undefined1 local_4a0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_498;
  undefined1 local_490;
  undefined1 local_488 [8];
  string inc;
  string local_448;
  MessageType local_428;
  byte local_421;
  MessageType messageType_1;
  bool noMessage;
  ostringstream e_1;
  string local_2a0;
  string local_280;
  MessageType local_25c;
  undefined1 local_258 [4];
  MessageType messageType;
  ostringstream e;
  string *entryInclude;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string usedIncludes;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  bool checkCMP0027;
  bool fromImported;
  string *targetName;
  cmLinkImplItem *item;
  TargetPropertyEntry *entry;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *__range1;
  bool debugIncludes_local;
  string *config_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *uniqueIncludes_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *includes_local;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *entries_local;
  cmGeneratorTarget *tgt_local;
  
  __end1 = std::
           vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
           ::begin(entries);
  entry = (TargetPropertyEntry *)
          std::
          vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
          ::end(entries);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
                                *)&entry);
    if (!bVar3) {
      return;
    }
    ppTVar6 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              ::operator*(&__end1);
    pTVar1 = *ppTVar6;
    this = pTVar1->LinkImplItem;
    psVar7 = cmLinkItem::AsStr_abi_cxx11_(&this->super_cmLinkItem);
    local_591 = false;
    if ((this->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0) {
      local_591 = cmGeneratorTarget::IsImported((this->super_cmLinkItem).Target);
    }
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_591;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = this->FromGenex & 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90);
    pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
    iVar4 = (*pTVar1->_vptr_TargetPropertyEntry[3])(pTVar1,pcVar8,config,0,tgt,dagChecker,language);
    cmSystemTools::ExpandListArgument
              ((string *)CONCAT44(extraout_var,iVar4),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90,false);
    std::__cxx11::string::string((string *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_90);
    entryInclude = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_90);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&entryInclude), bVar3) {
      filename = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      if (((entryIncludes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) &&
         (bVar3 = cmsys::SystemTools::FileExists(filename), !bVar3)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
        local_25c = FATAL_ERROR;
        if ((entryIncludes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
          PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0027(tgt);
          if (PVar5 != OLD) {
            if (PVar5 != WARN) goto LAB_00485c54;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_280,(cmPolicies *)0x1b,id);
            poVar9 = std::operator<<((ostream *)local_258,(string *)&local_280);
            std::operator<<(poVar9,"\n");
            std::__cxx11::string::~string((string *)&local_280);
          }
          local_25c = AUTHOR_WARNING;
        }
LAB_00485c54:
        poVar9 = std::operator<<((ostream *)local_258,"Imported target \"");
        poVar9 = std::operator<<(poVar9,(string *)psVar7);
        poVar9 = std::operator<<(poVar9,"\" includes non-existent path\n  \"");
        poVar9 = std::operator<<(poVar9,(string *)filename);
        std::operator<<(poVar9,
                        "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                       );
        pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
        MVar2 = local_25c;
        std::__cxx11::ostringstream::str();
        cmLocalGenerator::IssueMessage(pcVar8,MVar2,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        bVar3 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
        goto LAB_004864bc;
      }
      bVar3 = cmsys::SystemTools::FileIsFullPath(filename);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&messageType_1);
        local_421 = 0;
        local_428 = FATAL_ERROR;
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          poVar9 = std::operator<<((ostream *)&messageType_1,"Target \"");
          poVar9 = std::operator<<(poVar9,(string *)psVar7);
          poVar9 = std::operator<<(poVar9,
                                   "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \""
                                  );
          poVar9 = std::operator<<(poVar9,(string *)filename);
          std::operator<<(poVar9,"\"");
        }
        else {
          PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0021(tgt);
          if (PVar5 == OLD) {
            local_421 = 1;
          }
          else if (PVar5 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_448,(cmPolicies *)0x15,id_00);
            poVar9 = std::operator<<((ostream *)&messageType_1,(string *)&local_448);
            std::operator<<(poVar9,"\n");
            std::__cxx11::string::~string((string *)&local_448);
            local_428 = AUTHOR_WARNING;
          }
          poVar9 = std::operator<<((ostream *)&messageType_1,
                                   "Found relative path while evaluating include directories of \"")
          ;
          psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar9 = std::operator<<(poVar9,(string *)psVar10);
          poVar9 = std::operator<<(poVar9,"\":\n  \"");
          poVar9 = std::operator<<(poVar9,(string *)filename);
          std::operator<<(poVar9,"\"\n");
        }
        if ((local_421 & 1) == 0) {
          pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
          MVar2 = local_428;
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage(pcVar8,MVar2,(string *)((long)&inc.field_2 + 8));
          std::__cxx11::string::~string((string *)(inc.field_2._M_local_buf + 8));
          if (local_428 != FATAL_ERROR) goto LAB_0048606c;
          bVar3 = true;
        }
        else {
LAB_0048606c:
          bVar3 = false;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&messageType_1);
        if (bVar3) goto LAB_004864bc;
      }
      bVar3 = cmSystemTools::IsOff(filename);
      if (!bVar3) {
        cmsys::SystemTools::ConvertToUnixSlashes(filename);
      }
      std::__cxx11::string::string((string *)local_488,(string *)filename);
      pVar12 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(uniqueIncludes,(value_type *)local_488);
      local_4a8._M_cur =
           (__node_type *)
           pVar12.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_4a0 = pVar12.second;
      local_498._M_cur = local_4a8._M_cur;
      local_490 = local_4a0;
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (*pTVar1->_vptr_TargetPropertyEntry[4])(&local_4b8);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string&,cmListFileBacktrace>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   includes,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_488,&local_4b8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_4b8);
        if (debugIncludes) {
          std::operator+(&local_4f8," * ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_488);
          std::operator+(&local_4d8,&local_4f8,"\n");
          std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4f8);
        }
      }
      std::__cxx11::string::~string((string *)local_488);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) == 0) {
      pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
      this_00 = cmLocalGenerator::GetCMakeInstance(pcVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_578,"Used includes for target ",&local_579);
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_558,&local_578,psVar7);
      std::operator+(&local_538,&local_558,":\n");
      std::operator+(&local_518,&local_538,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2)
      ;
      (*pTVar1->_vptr_TargetPropertyEntry[4])(&local_590);
      cmake::IssueMessage(this_00,LOG,&local_518,&local_590);
      cmListFileBacktrace::~cmListFileBacktrace(&local_590);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)&local_558);
      std::__cxx11::string::~string((string *)&local_578);
      std::allocator<char>::~allocator(&local_579);
    }
    bVar3 = false;
LAB_004864bc:
    std::__cxx11::string::~string((string *)&__range2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
    if (bVar3) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

static void processIncludeDirectories(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& includes,
  std::unordered_set<std::string>& uniqueIncludes,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugIncludes, const std::string& language)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryIncludes);

    std::string usedIncludes;
    for (std::string& entryInclude : entryIncludes) {
      if (fromImported && !cmSystemTools::FileExists(entryInclude)) {
        std::ostringstream e;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (checkCMP0027) {
          switch (tgt->GetPolicyStatusCMP0027()) {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
              CM_FALLTHROUGH;
            case cmPolicies::OLD:
              messageType = MessageType::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
          }
        }
        /* clang-format off */
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << entryInclude << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        /* clang-format on */
        tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
        return;
      }

      if (!cmSystemTools::FileIsFullPath(entryInclude)) {
        std::ostringstream e;
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (!targetName.empty()) {
          /* clang-format off */
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << entryInclude << "\"";
          /* clang-format on */
        } else {
          switch (tgt->GetPolicyStatusCMP0021()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }
          e << "Found relative path while evaluating include directories of "
               "\""
            << tgt->GetName() << "\":\n  \"" << entryInclude << "\"\n";
        }
        if (!noMessage) {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == MessageType::FATAL_ERROR) {
            return;
          }
        }
      }

      if (!cmSystemTools::IsOff(entryInclude)) {
        cmSystemTools::ConvertToUnixSlashes(entryInclude);
      }
      std::string inc = entryInclude;

      if (uniqueIncludes.insert(inc).second) {
        includes.emplace_back(inc, entry->GetBacktrace());
        if (debugIncludes) {
          usedIncludes += " * " + inc + "\n";
        }
      }
    }
    if (!usedIncludes.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used includes for target ") + tgt->GetName() + ":\n" +
          usedIncludes,
        entry->GetBacktrace());
    }
  }
}